

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O0

size_t ares_name_label_cnt(char *name)

{
  bool bVar1;
  undefined8 local_28;
  size_t ndots;
  char *p;
  char *name_local;
  
  local_28 = 0;
  ndots = (size_t)name;
  if (name == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (ndots != 0) {
        bVar1 = *(char *)ndots != '\0';
      }
      if (!bVar1) break;
      if (*(char *)ndots == '.') {
        local_28 = local_28 + 1;
      }
      ndots = ndots + 1;
    }
    name_local = (char *)(local_28 + 1);
  }
  return (size_t)name_local;
}

Assistant:

size_t ares_name_label_cnt(const char *name)
{
  const char *p;
  size_t      ndots = 0;

  if (name == NULL) {
    return 0;
  }

  for (p = name; p != NULL && *p != 0; p++) {
    if (*p == '.') {
      ndots++;
    }
  }

  /* Label count is 1 greater than ndots */
  return ndots + 1;
}